

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_lexer_string * __thiscall pugi::impl::anon_unknown_0::xpath_lexer::contents(xpath_lexer *this)

{
  bool bVar1;
  xpath_lexer *this_local;
  
  bVar1 = true;
  if (((this->_cur_lexeme != lex_var_ref) && (bVar1 = true, this->_cur_lexeme != lex_number)) &&
     (bVar1 = true, this->_cur_lexeme != lex_string)) {
    bVar1 = this->_cur_lexeme == lex_quoted_string;
  }
  if (!bVar1) {
    __assert_fail("_cur_lexeme == lex_var_ref || _cur_lexeme == lex_number || _cur_lexeme == lex_string || _cur_lexeme == lex_quoted_string"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x2568,
                  "const xpath_lexer_string &pugi::impl::(anonymous namespace)::xpath_lexer::contents() const"
                 );
  }
  return &this->_cur_lexeme_contents;
}

Assistant:

const xpath_lexer_string& contents() const
		{
			assert(_cur_lexeme == lex_var_ref || _cur_lexeme == lex_number || _cur_lexeme == lex_string || _cur_lexeme == lex_quoted_string);

			return _cur_lexeme_contents;
		}